

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAM::fastPower(EAM *this,RealType x,int y)

{
  int in_ESI;
  EAM *in_XMM0_Qa;
  RealType RVar1;
  RealType temp;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  if (in_ESI == 0) {
    local_8 = 1.0;
  }
  else {
    RVar1 = fastPower(in_XMM0_Qa,(RealType)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                      (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if (in_ESI % 2 == 0) {
      local_8 = RVar1 * RVar1;
    }
    else if (in_ESI < 1) {
      local_8 = (RVar1 * RVar1) / (double)in_XMM0_Qa;
    }
    else {
      local_8 = (double)in_XMM0_Qa * RVar1 * RVar1;
    }
  }
  return local_8;
}

Assistant:

RealType EAM::fastPower(RealType x, int y) {
    RealType temp;
    if (y == 0) return 1;
    temp = fastPower(x, y / 2);
    if (y % 2 == 0)
      return temp * temp;
    else {
      if (y > 0)
        return x * temp * temp;
      else
        return (temp * temp) / x;
    }
  }